

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellReissner4.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellReissner4::ComputeNF
          (ChElementShellReissner4 *this,double U,double V,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  long lVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  char *__function;
  double *pdVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  *detJ = this->m_lenX * this->m_lenY * 0.25;
  lVar1 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (lVar1 < 3) {
LAB_00790206:
    __function = 
    "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  else {
    if (2 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows) {
      pdVar2 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pdVar6 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      uVar7 = 3;
      dVar3 = (U + 1.0) * 0.25;
      dVar4 = dVar3 * (V + 1.0);
      if (((ulong)pdVar6 & 7) == 0) {
        uVar8 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar8 < 3) {
          uVar7 = (ulong)uVar8;
        }
        if (uVar8 != 0) goto LAB_0078fe77;
        uVar7 = 0;
LAB_0078fe99:
        do {
          pdVar6[uVar7] = dVar4 * pdVar2[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar7 != 3);
      }
      else {
LAB_0078fe77:
        uVar9 = 0;
        do {
          pdVar6[uVar9] = dVar4 * pdVar2[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
        if ((int)uVar7 != 3) goto LAB_0078fe99;
      }
      if (lVar1 < 6) goto LAB_00790206;
      if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 6)
      goto LAB_0079021d;
      uVar7 = 3;
      pdVar6 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + 3;
      if (((ulong)pdVar6 & 7) == 0) {
        uVar8 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar8 < 3) {
          uVar7 = (ulong)uVar8;
        }
        if (uVar8 != 0) goto LAB_0078feef;
        uVar7 = 0;
LAB_0078ff10:
        do {
          pdVar6[uVar7] = dVar4 * pdVar2[uVar7 + 3];
          uVar7 = uVar7 + 1;
        } while (uVar7 != 3);
      }
      else {
LAB_0078feef:
        uVar9 = 0;
        do {
          pdVar6[uVar9] = dVar4 * pdVar2[uVar9 + 3];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
        if ((int)uVar7 != 3) goto LAB_0078ff10;
      }
      if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3)
      goto LAB_00790206;
      if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 9)
      goto LAB_0079021d;
      pdVar2 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      uVar7 = 3;
      dVar5 = (1.0 - U) * 0.25;
      pdVar6 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + 6;
      dVar4 = dVar5 * (V + 1.0);
      if (((ulong)pdVar6 & 7) == 0) {
        uVar8 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar8 < 3) {
          uVar7 = (ulong)uVar8;
        }
        if (uVar8 != 0) goto LAB_0078ff75;
        uVar7 = 0;
LAB_0078ff95:
        do {
          pdVar6[uVar7] = dVar4 * pdVar2[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar7 != 3);
      }
      else {
LAB_0078ff75:
        uVar9 = 0;
        do {
          pdVar6[uVar9] = dVar4 * pdVar2[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
        if ((int)uVar7 != 3) goto LAB_0078ff95;
      }
      if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 6)
      goto LAB_00790206;
      if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
          0xc) goto LAB_0079021d;
      pdVar2 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      uVar7 = 3;
      pdVar6 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + 9;
      if (((ulong)pdVar6 & 7) == 0) {
        uVar8 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar8 < 3) {
          uVar7 = (ulong)uVar8;
        }
        if (uVar8 != 0) goto LAB_0078ffed;
        uVar7 = 0;
LAB_0079000e:
        do {
          pdVar6[uVar7] = dVar4 * pdVar2[uVar7 + 3];
          uVar7 = uVar7 + 1;
        } while (uVar7 != 3);
      }
      else {
LAB_0078ffed:
        uVar9 = 0;
        do {
          pdVar6[uVar9] = dVar4 * pdVar2[uVar9 + 3];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
        if ((int)uVar7 != 3) goto LAB_0079000e;
      }
      if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3)
      goto LAB_00790206;
      if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
          0xf) goto LAB_0079021d;
      pdVar2 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      uVar7 = 3;
      dVar5 = dVar5 * (1.0 - V);
      pdVar6 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + 0xc;
      if (((ulong)pdVar6 & 7) == 0) {
        uVar8 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar8 < 3) {
          uVar7 = (ulong)uVar8;
        }
        if (uVar8 != 0) goto LAB_0079006f;
        uVar7 = 0;
LAB_0079008f:
        do {
          pdVar6[uVar7] = dVar5 * pdVar2[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar7 != 3);
      }
      else {
LAB_0079006f:
        uVar9 = 0;
        do {
          pdVar6[uVar9] = dVar5 * pdVar2[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
        if ((int)uVar7 != 3) goto LAB_0079008f;
      }
      if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 6)
      goto LAB_00790206;
      if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
          0x12) goto LAB_0079021d;
      pdVar2 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      uVar7 = 3;
      pdVar6 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + 0xf;
      if (((ulong)pdVar6 & 7) == 0) {
        uVar8 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar8 < 3) {
          uVar7 = (ulong)uVar8;
        }
        if (uVar8 != 0) goto LAB_007900e7;
        uVar7 = 0;
LAB_00790108:
        do {
          pdVar6[uVar7] = dVar5 * pdVar2[uVar7 + 3];
          uVar7 = uVar7 + 1;
        } while (uVar7 != 3);
      }
      else {
LAB_007900e7:
        uVar9 = 0;
        do {
          pdVar6[uVar9] = dVar5 * pdVar2[uVar9 + 3];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
        if ((int)uVar7 != 3) goto LAB_00790108;
      }
      if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 3)
      goto LAB_00790206;
      if ((Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows <
          0x15) goto LAB_0079021d;
      pdVar2 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
      pdVar6 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + 0x12;
      dVar3 = dVar3 * (1.0 - V);
      uVar7 = 3;
      if (((ulong)pdVar6 & 7) == 0) {
        uVar8 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
        if ((ulong)uVar8 < 3) {
          uVar7 = (ulong)uVar8;
        }
        if (uVar8 != 0) goto LAB_00790166;
        uVar7 = 0;
LAB_00790186:
        do {
          pdVar6[uVar7] = dVar3 * pdVar2[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar7 != 3);
      }
      else {
LAB_00790166:
        uVar9 = 0;
        do {
          pdVar6[uVar9] = dVar3 * pdVar2[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
        if ((int)uVar7 != 3) goto LAB_00790186;
      }
      if ((F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows < 6)
      goto LAB_00790206;
      if (0x17 < (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows) {
        pdVar2 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data;
        pdVar6 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_data + 0x15;
        uVar7 = 3;
        if (((ulong)pdVar6 & 7) == 0) {
          uVar8 = -((uint)((ulong)pdVar6 >> 3) & 0x1fffffff) & 7;
          if ((ulong)uVar8 < 3) {
            uVar7 = (ulong)uVar8;
          }
          if (uVar8 == 0) {
            uVar7 = 0;
            goto LAB_007901f0;
          }
        }
        uVar9 = 0;
        do {
          pdVar6[uVar9] = dVar3 * pdVar2[uVar9 + 3];
          uVar9 = uVar9 + 1;
        } while (uVar7 != uVar9);
        if ((int)uVar7 == 3) {
          return;
        }
LAB_007901f0:
        do {
          pdVar6[uVar7] = dVar3 * pdVar2[uVar7 + 3];
          uVar7 = uVar7 + 1;
        } while (uVar7 != 3);
        return;
      }
    }
LAB_0079021d:
    __function = 
    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChElementShellReissner4::ComputeNF(
    const double U,              // parametric coordinate in surface
    const double V,              // parametric coordinate in surface
    ChVectorDynamic<>& Qi,       // Return result of Q = N'*F  here
    double& detJ,                // Return det[J] here
    const ChVectorDynamic<>& F,  // Input F vector, size is =n. field coords.
    ChVectorDynamic<>* state_x,  // if != 0, update state (pos. part) to this, then evaluate Q
    ChVectorDynamic<>* state_w   // if != 0, update state (speed part) to this, then evaluate Q
    ) {
    ShapeVector N;
    ShapeFunctions(N, U, V);

    //***TODO*** exact det of jacobian at u,v
    detJ = GetLengthX() * GetLengthY() / 4.0;  // approximate

    Qi.segment(0, 3) = N(0) * F.segment(0, 3);
    Qi.segment(3, 3) = N(0) * F.segment(3, 3);

    Qi.segment(6, 3) = N(1) * F.segment(0, 3);
    Qi.segment(9, 3) = N(1) * F.segment(3, 3);

    Qi.segment(12, 3) = N(2) * F.segment(0, 3);
    Qi.segment(15, 3) = N(2) * F.segment(3, 3);

    Qi.segment(18, 3) = N(3) * F.segment(0, 3);
    Qi.segment(21, 3) = N(3) * F.segment(3, 3);
}